

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

void slang::getMacroArgExpansions
               (SourceManager *sm,SourceLocation loc,bool isStart,
               SmallVectorBase<slang::BufferID> *results)

{
  bool bVar1;
  SmallVectorBase<slang::BufferID> *in_RCX;
  byte in_DL;
  SourceLocation in_RSI;
  SourceRange range;
  BufferID *in_stack_ffffffffffffff88;
  SmallVectorBase<slang::BufferID> *this;
  SourceLocation in_stack_ffffffffffffff98;
  SourceRange local_58;
  SourceLocation in_stack_ffffffffffffffb8;
  SourceLocation in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  BufferID in_stack_ffffffffffffffcc;
  SourceLocation SVar2;
  SourceLocation local_8;
  
  local_8 = in_RSI;
  while (bVar1 = SourceManager::isMacroLoc
                           ((SourceManager *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0),
        bVar1) {
    SVar2 = local_8;
    bVar1 = SourceManager::isMacroArgLoc
                      ((SourceManager *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
    if (bVar1) {
      this = in_RCX;
      in_stack_ffffffffffffffcc =
           SourceLocation::buffer((SourceLocation *)in_stack_ffffffffffffff98);
      SmallVectorBase<slang::BufferID>::push_back(this,in_stack_ffffffffffffff88);
      SVar2._4_4_ = in_stack_ffffffffffffffcc.id;
      SVar2._0_4_ = in_stack_ffffffffffffffc8;
      in_stack_ffffffffffffffc0 =
           SourceManager::getOriginalLoc((SourceManager *)in_stack_ffffffffffffffc0,SVar2);
      in_stack_ffffffffffffffb8 = local_8;
      local_8 = in_stack_ffffffffffffffc0;
    }
    else {
      local_58 = SourceManager::getExpansionRange
                           ((SourceManager *)
                            CONCAT44(in_stack_ffffffffffffffcc.id,in_stack_ffffffffffffffc8),SVar2);
      if ((in_DL & 1) == 0) {
        in_stack_ffffffffffffff98 = SourceRange::end(&local_58);
        local_8 = in_stack_ffffffffffffff98;
      }
      else {
        in_stack_ffffffffffffff98 = SourceRange::start(&local_58);
        local_8 = in_stack_ffffffffffffff98;
      }
    }
  }
  return;
}

Assistant:

static void getMacroArgExpansions(const SourceManager& sm, SourceLocation loc, bool isStart,
                                  SmallVectorBase<BufferID>& results) {
    while (sm.isMacroLoc(loc)) {
        if (sm.isMacroArgLoc(loc)) {
            results.push_back(loc.buffer());
            loc = sm.getOriginalLoc(loc);
        }
        else {
            auto range = sm.getExpansionRange(loc);
            loc = isStart ? range.start() : range.end();
        }
    }
}